

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_path_builder_delegate.cc
# Opt level: O0

bool __thiscall
bssl::SimplePathBuilderDelegate::IsSignatureAlgorithmAcceptable
          (SimplePathBuilderDelegate *this,SignatureAlgorithm algorithm,CertErrors *errors)

{
  CertErrors *errors_local;
  SignatureAlgorithm algorithm_local;
  SimplePathBuilderDelegate *this_local;
  
  if (algorithm == kRsaPkcs1Sha1) {
LAB_00608dc6:
    this_local._7_1_ = this->digest_policy_ == kMaxValue;
  }
  else {
    if (2 < algorithm - kRsaPkcs1Sha256) {
      if (algorithm == kEcdsaSha1) goto LAB_00608dc6;
      if (5 < algorithm - kEcdsaSha256) {
        return false;
      }
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool SimplePathBuilderDelegate::IsSignatureAlgorithmAcceptable(
    SignatureAlgorithm algorithm, CertErrors *errors) {
  switch (algorithm) {
    case SignatureAlgorithm::kRsaPkcs1Sha1:
    case SignatureAlgorithm::kEcdsaSha1:
      return digest_policy_ == DigestPolicy::kWeakAllowSha1;

    case SignatureAlgorithm::kRsaPkcs1Sha256:
    case SignatureAlgorithm::kRsaPkcs1Sha384:
    case SignatureAlgorithm::kRsaPkcs1Sha512:
    case SignatureAlgorithm::kEcdsaSha256:
    case SignatureAlgorithm::kEcdsaSha384:
    case SignatureAlgorithm::kEcdsaSha512:
    case SignatureAlgorithm::kRsaPssSha256:
    case SignatureAlgorithm::kRsaPssSha384:
    case SignatureAlgorithm::kRsaPssSha512:
      return true;
  }
  return false;
}